

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_hmac.c
# Opt level: O0

err_t beltHMAC(octet *mac,void *src,size_t count,octet *key,size_t len)

{
  bool_t bVar1;
  blob_t state_00;
  void *in_RCX;
  void *in_RDX;
  octet *in_RSI;
  void *in_RDI;
  octet *in_R8;
  void *state;
  size_t in_stack_ffffffffffffffc8;
  
  bVar1 = memIsValid(in_RSI,(size_t)in_RDX);
  if (((bVar1 != 0) && (bVar1 = memIsValid(in_RCX,(size_t)in_R8), bVar1 != 0)) &&
     (bVar1 = memIsValid(in_RDI,0x20), bVar1 != 0)) {
    beltHMAC_keep();
    state_00 = blobCreate(in_stack_ffffffffffffffc8);
    if (state_00 == (blob_t)0x0) {
      return 0x6e;
    }
    beltHMACStart(in_RDI,in_RSI,(size_t)in_RDX);
    beltHMACStepA(in_RDX,(size_t)in_RCX,in_R8);
    beltHMACStepG(in_R8,state_00);
    blobClose((blob_t)0x15c392);
    return 0;
  }
  return 0x6d;
}

Assistant:

err_t beltHMAC(octet mac[32], const void* src, size_t count,
	const octet key[], size_t len)
{
	void* state;
	// проверить входные данные
	if (!memIsValid(src, count) ||
		!memIsValid(key, len) ||
		!memIsValid(mac, 32))
		return ERR_BAD_INPUT;
	// создать состояние
	state = blobCreate(beltHMAC_keep());
	if (state == 0)
		return ERR_OUTOFMEMORY;
	// выработать имитовставку
	beltHMACStart(state, key, len);
	beltHMACStepA(src, count, state);
	beltHMACStepG(mac, state);
	// завершить
	blobClose(state);
	return ERR_OK;
}